

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

ExprPtr __thiscall pegmatite::operator>>(pegmatite *this,ExprPtr *left,ExprPtr *right)

{
  SequenceExpr *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ExprPtr EVar1;
  ExprPtr local_40;
  ExprPtr local_30;
  ExprPtr *local_20;
  ExprPtr *right_local;
  ExprPtr *left_local;
  
  local_20 = right;
  right_local = left;
  left_local = (ExprPtr *)this;
  this_00 = (SequenceExpr *)operator_new(0x28);
  ExprPtr::ExprPtr(&local_30,right_local);
  ExprPtr::ExprPtr(&local_40,local_20);
  anon_unknown.dwarf_50a29::SequenceExpr::SequenceExpr(this_00,&local_30,&local_40);
  ExprPtr::ExprPtr((ExprPtr *)this,(Expr *)this_00);
  ExprPtr::~ExprPtr(&local_40);
  ExprPtr::~ExprPtr(&local_30);
  EVar1.super_shared_ptr<pegmatite::Expr>.
  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar1.super_shared_ptr<pegmatite::Expr>.
  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ExprPtr)EVar1.super_shared_ptr<pegmatite::Expr>.
                  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ExprPtr operator >> (const ExprPtr &left, const ExprPtr &right)
{
	return ExprPtr(new SequenceExpr(left, right));
}